

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

bool flatbuffers::StringIsFlatbufferPositiveInfinity(string *s)

{
  bool bVar1;
  
  bVar1 = std::operator==(s,"inf");
  if (!bVar1) {
    bVar1 = std::operator==(s,"+inf");
    if (!bVar1) {
      bVar1 = std::operator==(s,"infinity");
      if (!bVar1) {
        bVar1 = std::operator==(s,"+infinity");
        return bVar1;
      }
    }
  }
  return true;
}

Assistant:

inline bool StringIsFlatbufferPositiveInfinity(const std::string &s) {
  return s == "inf" || s == "+inf" || s == "infinity" || s == "+infinity";
}